

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O0

int32_t duckdb::TimeBucket::EpochMonths<duckdb::timestamp_t>(timestamp_t ts)

{
  date_t dVar1;
  int iVar2;
  int iVar3;
  timestamp_t in_stack_00000018;
  date_t ts_date;
  
  dVar1 = Cast::Operation<duckdb::timestamp_t,duckdb::date_t>(in_stack_00000018);
  iVar2 = duckdb::Date::ExtractYear(dVar1);
  iVar3 = duckdb::Date::ExtractMonth(dVar1);
  return (iVar2 + -0x7b2) * 0xc + iVar3 + -1;
}

Assistant:

static inline int32_t EpochMonths(T ts) {
		date_t ts_date = Cast::template Operation<T, date_t>(ts);
		return (Date::ExtractYear(ts_date) - 1970) * 12 + Date::ExtractMonth(ts_date) - 1;
	}